

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_init_write__internal
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_uint64 totalSampleCount)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ma_dr_wav *pWav_00;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  ma_uint64 chunkSizeDATA_1;
  ma_uint32 chunkSizeDATA;
  ma_uint64 initialRiffChunkSize;
  ma_uint32 initialds64ChunkSize;
  ma_uint64 chunkSizeRIFF_1;
  ma_uint32 chunkSizeRIFF;
  ma_uint64 chunkSizeFMT;
  ma_uint64 initialDataChunkSize;
  size_t runningPos;
  ma_uint32 in_stack_000000ec;
  ma_dr_wav_metadata *in_stack_000000f0;
  ma_dr_wav *in_stack_000000f8;
  ma_dr_wav *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_30;
  long local_28;
  ma_bool32 local_4;
  
  local_30 = 0;
  if (((*(int *)(in_RDI + 0xa8) == 0) ||
      (local_30 = in_RDX * (ulong)*(ushort *)(in_RDI + 0x52) >> 3, *in_RSI != 0)) ||
     (local_30 < 0xffffffdc)) {
    *(ulong *)(in_RDI + 0xa0) = local_30;
    if (*in_RSI == 0) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b662);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b69a);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    else if (*in_RSI == 2) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b6d7);
      sVar2 = ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x24b6f0);
      sVar3 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b710);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    else {
      if (*in_RSI != 3) {
        return 0;
      }
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b73c);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b775);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    if (*in_RSI == 3) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b7d1);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x24b802);
      sVar4 = ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x24b81b);
      sVar5 = ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x24b834);
      sVar6 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1 + local_28;
    }
    if ((*in_RSI == 0) || (*in_RSI == 3)) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b887);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar2 + sVar1 + local_28;
    }
    else if (*in_RSI == 2) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24b8d7);
      sVar2 = ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x24b8f0);
      local_28 = sVar2 + sVar1 + local_28;
    }
    sVar1 = ma_dr_wav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar2 = ma_dr_wav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar3 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    sVar4 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    sVar5 = ma_dr_wav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar6 = ma_dr_wav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    local_28 = sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1 + local_28;
    if (((*(int *)(in_RDI + 0xa8) == 0) && (*(long *)(in_RDI + 0xb0) != 0)) &&
       ((*(int *)(in_RDI + 0xb8) != 0 && ((*in_RSI == 0 || (*in_RSI == 3)))))) {
      sVar1 = ma_dr_wav__write_or_count_metadata
                        (in_stack_000000f8,in_stack_000000f0,in_stack_000000ec);
      local_28 = sVar1 + local_28;
    }
    *(long *)(in_RDI + 0x88) = local_28;
    if (*in_RSI == 0) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)CONCAT44((int)local_30,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24ba4c);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar2 + sVar1 + local_28;
    }
    else if (*in_RSI == 2) {
      pWav_00 = (ma_dr_wav *)(local_30 + 0x18);
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pWav_00
                               ,0x24baa0);
      sVar2 = ma_dr_wav__write_u64ne_to_le(pWav_00,0x24bab8);
      local_28 = sVar2 + sVar1 + local_28;
    }
    else if (*in_RSI == 3) {
      sVar1 = ma_dr_wav__write((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,0x24bae4);
      sVar2 = ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar2 + sVar1 + local_28;
    }
    *(int *)(in_RDI + 0x40) = *in_RSI;
    *(short *)(in_RDI + 0x70) = (short)in_RSI[2];
    *(int *)(in_RDI + 0x6c) = in_RSI[3];
    *(short *)(in_RDI + 0x72) = (short)in_RSI[4];
    *(short *)(in_RDI + 0x74) = (short)in_RSI[1];
    *(long *)(in_RDI + 0x88) = local_28;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_write__internal(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount)
{
    size_t runningPos = 0;
    ma_uint64 initialDataChunkSize = 0;
    ma_uint64 chunkSizeFMT;
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;
        if (pFormat->container == ma_dr_wav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return MA_FALSE;
            }
        }
    }
    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeRIFF = 28 + (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "RIFF", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_RIFF, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_WAVE, 16);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "RF64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else {
        return MA_FALSE;
    }
    if (pFormat->container == ma_dr_wav_container_rf64) {
        ma_uint32 initialds64ChunkSize = 28;
        ma_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "ds64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, initialds64ChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialRiffChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialDataChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, totalSampleCount);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0);
    }
    if (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += ma_dr_wav__write(pWav, "fmt ", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, (ma_uint32)chunkSizeFMT);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_FMT, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);
    if (!pWav->isSequentialWrite && pWav->pMetadata != NULL && pWav->metadataCount > 0 && (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64)) {
        runningPos += ma_dr_wav__write_or_count_metadata(pWav, pWav->pMetadata, pWav->metadataCount);
    }
    pWav->dataChunkDataPos = runningPos;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeDATA = (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeDATA = 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_DATA, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
    }
    pWav->container = pFormat->container;
    pWav->channels = (ma_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (ma_uint16)pFormat->format;
    pWav->dataChunkDataPos = runningPos;
    return MA_TRUE;
}